

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel_sse.c
# Opt level: O0

void uavs3d_conv_fmt_8bit_sse
               (uchar *src_y,uchar *src_uv,uchar **dst,int width,int height,int src_stride,
               int src_stridec,int *dst_stride,int uv_shift)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong *puVar3;
  ulong uVar4;
  ulong uVar5;
  int width16;
  int j2;
  int j;
  int i;
  uchar *p_dst_v;
  uchar *p_dst_u;
  uchar *p_dst_y;
  uchar *p_src;
  __m128i msrcv;
  __m128i msrcu;
  __m128i msrc;
  __m128i uv_mask;
  int src_stride_local;
  int height_local;
  int width_local;
  uchar **dst_local;
  uchar *src_uv_local;
  uchar *src_y_local;
  ushort local_98;
  ushort uStack_96;
  ushort uStack_94;
  ushort uStack_92;
  ushort uStack_90;
  ushort uStack_8e;
  ushort uStack_8c;
  ushort uStack_8a;
  ushort local_88;
  ushort uStack_86;
  ushort uStack_84;
  ushort uStack_82;
  ushort uStack_80;
  ushort uStack_7e;
  ushort uStack_7c;
  ushort uStack_7a;
  ulong local_58;
  ulong uStack_50;
  
  p_dst_u = *dst;
  p_dst_v = dst[1];
  _j = dst[2];
  p_dst_y = src_y;
  for (j2 = 0; j2 < height; j2 = j2 + 1) {
    memcpy(p_dst_u,p_dst_y,(long)width);
    p_dst_y = p_dst_y + src_stride;
    p_dst_u = p_dst_u + *dst_stride;
  }
  iVar2 = (width >> ((byte)uv_shift & 0x1f)) << 1;
  p_dst_y = src_uv;
  for (j2 = 0; j2 < height >> ((byte)uv_shift & 0x1f); j2 = j2 + 1) {
    for (width16 = 0; width16 < (iVar2 >> 4) << 4; width16 = width16 + 0x10) {
      puVar3 = (ulong *)(p_dst_y + width16);
      uVar5 = puVar3[1];
      msrc[0]._1_1_ = (undefined1)(uVar5 >> 8);
      msrc[0]._2_1_ = (undefined1)(uVar5 >> 0x10);
      msrc[0]._3_1_ = (undefined1)(uVar5 >> 0x18);
      msrc[0]._4_1_ = (undefined1)(uVar5 >> 0x20);
      msrc[0]._5_1_ = (undefined1)(uVar5 >> 0x28);
      msrc[0]._6_1_ = (undefined1)(uVar5 >> 0x30);
      msrc[0]._7_1_ = (undefined1)(uVar5 >> 0x38);
      uVar4 = *puVar3 & 0xff00ff00ff00ff;
      uVar5 = uVar5 & 0xff00ff00ff00ff;
      auVar1[9] = msrc[0]._1_1_;
      auVar1._0_9_ = *(unkbyte9 *)puVar3;
      auVar1[10] = msrc[0]._2_1_;
      auVar1[0xb] = msrc[0]._3_1_;
      auVar1[0xc] = msrc[0]._4_1_;
      auVar1[0xd] = msrc[0]._5_1_;
      auVar1[0xe] = msrc[0]._6_1_;
      auVar1[0xf] = msrc[0]._7_1_;
      local_58 = (ulong)((unkuint9)*(unkbyte9 *)puVar3 >> 8);
      uStack_50 = auVar1._8_8_ >> 8;
      local_58 = local_58 & 0xff00ff00ff00ff;
      uStack_50 = uStack_50 & 0xff00ff00ff00ff;
      local_88 = (ushort)uVar4;
      uStack_86 = (ushort)(uVar4 >> 0x10);
      uStack_84 = (ushort)(uVar4 >> 0x20);
      uStack_82 = (ushort)(uVar4 >> 0x30);
      uStack_80 = (ushort)uVar5;
      uStack_7e = (ushort)(uVar5 >> 0x10);
      uStack_7c = (ushort)(uVar5 >> 0x20);
      uStack_7a = (ushort)(uVar5 >> 0x30);
      local_98 = (ushort)local_58;
      uStack_96 = (ushort)(local_58 >> 0x10);
      uStack_94 = (ushort)(local_58 >> 0x20);
      uStack_92 = (ushort)(local_58 >> 0x30);
      uStack_90 = (ushort)uStack_50;
      uStack_8e = (ushort)(uStack_50 >> 0x10);
      uStack_8c = (ushort)(uStack_50 >> 0x20);
      uStack_8a = (ushort)(uStack_50 >> 0x30);
      *(ulong *)(p_dst_v + (width16 >> 1)) =
           CONCAT17((uStack_7a != 0) * (uStack_7a < 0x100) * (char)(uVar5 >> 0x30) -
                    (0xff < uStack_7a),
                    CONCAT16((uStack_7c != 0) * (uStack_7c < 0x100) * (char)(uVar5 >> 0x20) -
                             (0xff < uStack_7c),
                             CONCAT15((uStack_7e != 0) * (uStack_7e < 0x100) * (char)(uVar5 >> 0x10)
                                      - (0xff < uStack_7e),
                                      CONCAT14((uStack_80 != 0) * (uStack_80 < 0x100) * (char)uVar5
                                               - (0xff < uStack_80),
                                               CONCAT13((uStack_82 != 0) * (uStack_82 < 0x100) *
                                                        (char)(uVar4 >> 0x30) - (0xff < uStack_82),
                                                        CONCAT12((uStack_84 != 0) *
                                                                 (uStack_84 < 0x100) *
                                                                 (char)(uVar4 >> 0x20) -
                                                                 (0xff < uStack_84),
                                                                 CONCAT11((uStack_86 != 0) *
                                                                          (uStack_86 < 0x100) *
                                                                          (char)(uVar4 >> 0x10) -
                                                                          (0xff < uStack_86),
                                                                          (local_88 != 0) *
                                                                          (local_88 < 0x100) *
                                                                          (char)uVar4 -
                                                                          (0xff < local_88))))))));
      *(ulong *)(_j + (width16 >> 1)) =
           CONCAT17((uStack_8a != 0) * (uStack_8a < 0x100) * (char)(uStack_50 >> 0x30) -
                    (0xff < uStack_8a),
                    CONCAT16((uStack_8c != 0) * (uStack_8c < 0x100) * (char)(uStack_50 >> 0x20) -
                             (0xff < uStack_8c),
                             CONCAT15((uStack_8e != 0) * (uStack_8e < 0x100) *
                                      (char)(uStack_50 >> 0x10) - (0xff < uStack_8e),
                                      CONCAT14((uStack_90 != 0) * (uStack_90 < 0x100) *
                                               (char)uStack_50 - (0xff < uStack_90),
                                               CONCAT13((uStack_92 != 0) * (uStack_92 < 0x100) *
                                                        (char)(local_58 >> 0x30) -
                                                        (0xff < uStack_92),
                                                        CONCAT12((uStack_94 != 0) *
                                                                 (uStack_94 < 0x100) *
                                                                 (char)(local_58 >> 0x20) -
                                                                 (0xff < uStack_94),
                                                                 CONCAT11((uStack_96 != 0) *
                                                                          (uStack_96 < 0x100) *
                                                                          (char)(local_58 >> 0x10) -
                                                                          (0xff < uStack_96),
                                                                          (local_98 != 0) *
                                                                          (local_98 < 0x100) *
                                                                          (char)local_58 -
                                                                          (0xff < local_98))))))));
    }
    for (; width16 < iVar2; width16 = width16 + 2) {
      p_dst_v[width16 >> 1] = p_dst_y[width16];
      _j[width16 >> 1] = p_dst_y[width16 + 1];
    }
    p_dst_y = p_dst_y + src_stridec;
    p_dst_v = p_dst_v + dst_stride[1];
    _j = _j + dst_stride[2];
  }
  return;
}

Assistant:

void uavs3d_conv_fmt_8bit_sse(unsigned char* src_y, unsigned char* src_uv, unsigned char* dst[3], int width, int height, int src_stride, int src_stridec, int dst_stride[3], int uv_shift)
{
    __m128i uv_mask = _mm_set1_epi16(0xff), msrc, msrcu, msrcv;
    unsigned char* p_src = src_y;
    unsigned char* p_dst_y = dst[0];
    unsigned char* p_dst_u = dst[1];
    unsigned char* p_dst_v = dst[2];
    int i, j, j2;
    int width16;
    for (i = 0; i < height; i++) {
        memcpy(p_dst_y, p_src, width);
        p_src += src_stride;
        p_dst_y += dst_stride[0];
    }
    width >>= uv_shift;
    height >>= uv_shift;

    p_src = src_uv;
    width <<= 1;
    width16 = (width >> 4) << 4;
    for (i = 0; i < height; i++) {
        for (j = 0; j < width16; j += 16) {
            j2 = j >> 1;
            msrc = _mm_loadu_si128((const __m128i*)(p_src + j));
            msrcu = _mm_and_si128(msrc, uv_mask);
            msrcv = _mm_and_si128(_mm_srli_si128(msrc, 1), uv_mask);
            msrc = _mm_packus_epi16(msrcu, msrcv);
            _mm_storel_epi64((__m128i*)(p_dst_u + j2), msrc);
            _mm_storel_epi64((__m128i*)(p_dst_v + j2), _mm_srli_si128(msrc, 8));
        }
        for (; j < width; j += 2) {
            p_dst_u[j >> 1] = p_src[j];
            p_dst_v[j >> 1] = p_src[j + 1];
        }
        p_src += src_stridec;
        p_dst_u += dst_stride[1];
        p_dst_v += dst_stride[2];
    }
}